

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleSlice.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  string_view attrName;
  string_view attrName_00;
  string_view attrName_01;
  string_view attrName_02;
  string_view attribute;
  string_view attribute_00;
  bool bVar1;
  Builder *pBVar2;
  Builder *pBVar3;
  uint8_t *start;
  ostream *poVar4;
  ValueLength VVar5;
  void *pvVar6;
  int64_t iVar7;
  exception *ex;
  char *st;
  ValueLength len;
  Slice sss;
  Slice ss;
  Slice s;
  Builder b;
  undefined4 in_stack_fffffffffffffc78;
  undefined2 in_stack_fffffffffffffc7c;
  ValueType in_stack_fffffffffffffc7e;
  ValueType in_stack_fffffffffffffc7f;
  Builder *in_stack_fffffffffffffc80;
  undefined6 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8e;
  ValueType in_stack_fffffffffffffc8f;
  Builder *in_stack_fffffffffffffc90;
  char *in_stack_fffffffffffffc98;
  char *in_stack_fffffffffffffca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  Builder *in_stack_fffffffffffffcb0;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_fffffffffffffcb8;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_fffffffffffffcc8;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this_00;
  allocator<char> local_211;
  string local_210 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  undefined8 local_1e8;
  uint8_t *local_1d0;
  uint8_t *local_1c8;
  uint8_t *local_1b0;
  Slice local_1a8;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> local_1a0 [404];
  int local_c;
  undefined8 local_8;
  
  local_c = 0;
  arangodb::velocypack::Builder::Builder(in_stack_fffffffffffffcb0);
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8f,
             (bool)in_stack_fffffffffffffc8e);
  arangodb::velocypack::Builder::operator()
            (in_stack_fffffffffffffc80,
             (Value *)CONCAT17(in_stack_fffffffffffffc7f,
                               CONCAT16(in_stack_fffffffffffffc7e,
                                        CONCAT24(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78
                                                ))));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc90,
             (char *)CONCAT17(in_stack_fffffffffffffc8f,
                              CONCAT16(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88)));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffc80,
             CONCAT13(in_stack_fffffffffffffc7f,
                      CONCAT12(in_stack_fffffffffffffc7e,in_stack_fffffffffffffc7c)),
             (ValueType)((uint)in_stack_fffffffffffffc78 >> 0x18));
  attrName._M_str = in_stack_fffffffffffffca0;
  attrName._M_len = (size_t)in_stack_fffffffffffffc98;
  arangodb::velocypack::Builder::operator()
            (in_stack_fffffffffffffc90,attrName,
             (Value *)CONCAT17(in_stack_fffffffffffffc8f,
                               CONCAT16(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88)));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc90,
             (char *)CONCAT17(in_stack_fffffffffffffc8f,
                              CONCAT16(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88)));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffc80,(bool)in_stack_fffffffffffffc7f,
             in_stack_fffffffffffffc7e);
  attrName_00._M_str = in_stack_fffffffffffffca0;
  attrName_00._M_len = (size_t)in_stack_fffffffffffffc98;
  arangodb::velocypack::Builder::operator()
            (in_stack_fffffffffffffc90,attrName_00,
             (Value *)CONCAT17(in_stack_fffffffffffffc8f,
                               CONCAT16(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88)));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc90,
             (char *)CONCAT17(in_stack_fffffffffffffc8f,
                              CONCAT16(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88)));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8f,
             (bool)in_stack_fffffffffffffc8e);
  attrName_01._M_str = in_stack_fffffffffffffca0;
  attrName_01._M_len = (size_t)in_stack_fffffffffffffc98;
  arangodb::velocypack::Builder::operator()
            (in_stack_fffffffffffffc90,attrName_01,
             (Value *)CONCAT17(in_stack_fffffffffffffc8f,
                               CONCAT16(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88)));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffc80,
             CONCAT13(in_stack_fffffffffffffc7f,
                      CONCAT12(in_stack_fffffffffffffc7e,in_stack_fffffffffffffc7c)),
             (ValueType)((uint)in_stack_fffffffffffffc78 >> 0x18));
  arangodb::velocypack::Builder::operator()
            (in_stack_fffffffffffffc80,
             (Value *)CONCAT17(in_stack_fffffffffffffc7f,
                               CONCAT16(in_stack_fffffffffffffc7e,
                                        CONCAT24(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78
                                                ))));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffc80,
             CONCAT13(in_stack_fffffffffffffc7f,
                      CONCAT12(in_stack_fffffffffffffc7e,in_stack_fffffffffffffc7c)),
             (ValueType)((uint)in_stack_fffffffffffffc78 >> 0x18));
  arangodb::velocypack::Builder::operator()
            (in_stack_fffffffffffffc80,
             (Value *)CONCAT17(in_stack_fffffffffffffc7f,
                               CONCAT16(in_stack_fffffffffffffc7e,
                                        CONCAT24(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78
                                                ))));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffc80,
             CONCAT13(in_stack_fffffffffffffc7f,
                      CONCAT12(in_stack_fffffffffffffc7e,in_stack_fffffffffffffc7c)),
             (ValueType)((uint)in_stack_fffffffffffffc78 >> 0x18));
  arangodb::velocypack::Builder::operator()
            (in_stack_fffffffffffffc80,
             (Value *)CONCAT17(in_stack_fffffffffffffc7f,
                               CONCAT16(in_stack_fffffffffffffc7e,
                                        CONCAT24(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78
                                                ))));
  pBVar2 = arangodb::velocypack::Builder::operator()(in_stack_fffffffffffffc80);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc90,
             (char *)CONCAT17(in_stack_fffffffffffffc8f,
                              CONCAT16(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88)));
  this_00 = local_1a0;
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffc80,
             (char *)CONCAT17(in_stack_fffffffffffffc7f,
                              CONCAT16(in_stack_fffffffffffffc7e,
                                       CONCAT24(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78)
                                      )),None);
  attrName_02._M_str = in_stack_fffffffffffffca0;
  attrName_02._M_len = (size_t)in_stack_fffffffffffffc98;
  pBVar3 = arangodb::velocypack::Builder::operator()
                     (in_stack_fffffffffffffc90,attrName_02,
                      (Value *)CONCAT17(in_stack_fffffffffffffc8f,
                                        CONCAT16(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88
                                                )));
  arangodb::velocypack::Builder::operator()(in_stack_fffffffffffffc80);
  start = arangodb::velocypack::Builder::start(in_stack_fffffffffffffc80);
  arangodb::velocypack::Slice::Slice(&local_1a8,start);
  std::operator<<((ostream *)&std::cout,"Slice: ");
  poVar4 = arangodb::velocypack::operator<<
                     ((ostream *)in_stack_fffffffffffffc80,
                      (Slice *)CONCAT17(in_stack_fffffffffffffc7f,
                                        CONCAT16(in_stack_fffffffffffffc7e,
                                                 CONCAT24(in_stack_fffffffffffffc7c,
                                                          in_stack_fffffffffffffc78))));
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Type: ");
  arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::type
            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
             in_stack_fffffffffffffc80);
  poVar4 = operator<<((ostream *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7f);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Bytesize: ");
  VVar5 = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
          ::byteSize((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                     in_stack_fffffffffffffc80);
  pvVar6 = (void *)std::ostream::operator<<(poVar4,VVar5);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Members: ");
  VVar5 = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
          ::length(in_stack_fffffffffffffcc8);
  pvVar6 = (void *)std::ostream::operator<<(poVar4,VVar5);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  bVar1 = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
          ::isObject((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x1038fd
                    );
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc90,
               (char *)CONCAT17(in_stack_fffffffffffffc8f,
                                CONCAT16(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88)));
    attribute._M_str = (char *)pBVar2;
    attribute._M_len = (size_t)pBVar3;
    local_1b0 = (uint8_t *)
                arangodb::velocypack::
                SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::get
                          (this_00,attribute);
    poVar4 = std::operator<<((ostream *)&std::cout,"Length of .l: ");
    VVar5 = arangodb::velocypack::
            SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::length
                      (in_stack_fffffffffffffcc8);
    pvVar6 = (void *)std::ostream::operator<<(poVar4,VVar5);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"Second entry of .l:");
    local_1c8 = (uint8_t *)
                arangodb::velocypack::
                SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::at
                          ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           CONCAT17(in_stack_fffffffffffffc8f,
                                    CONCAT16(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88)),
                           (ValueLength)in_stack_fffffffffffffc80);
    iVar7 = arangodb::velocypack::
            SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getInt
                      (in_stack_fffffffffffffcb8);
    pvVar6 = (void *)std::ostream::operator<<(poVar4,iVar7);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc90,
             (char *)CONCAT17(in_stack_fffffffffffffc8f,
                              CONCAT16(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88)));
  attribute_00._M_str = (char *)pBVar2;
  attribute_00._M_len = (size_t)pBVar3;
  local_1d0 = (uint8_t *)
              arangodb::velocypack::
              SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::get
                        (this_00,attribute_00);
  bVar1 = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
          ::isString((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x103ab7
                    );
  if (bVar1) {
    local_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                arangodb::velocypack::
                SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getString
                          ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           in_stack_fffffffffffffc90,
                           (ValueLength *)
                           CONCAT17(in_stack_fffffffffffffc8f,
                                    CONCAT16(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88)));
    poVar4 = std::operator<<((ostream *)&std::cout,"Name in .name: ");
    local_8 = local_1e8;
    this = local_1f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (this,in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90,
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffffc8f,
                        CONCAT16(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88)));
    poVar4 = std::operator<<(poVar4,local_210);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc80);
    std::allocator<char>::~allocator(&local_211);
  }
  arangodb::velocypack::Builder::~Builder(in_stack_fffffffffffffc80);
  return local_c;
}

Assistant:

int main(int, char*[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  // create an object with attributes "b", "a", "l" and "name"
  // note that the attribute names will be sorted in the target VPack object!
  Builder b;

  b(Value(ValueType::Object))("b", Value(12))("a", Value(true))(
      "l", Value(ValueType::Array))(Value(1))(Value(2))(Value(3))()(
      "name", Value("Gustav"))();

  // a Slice is a lightweight accessor for a VPack value
  Slice s(b.start());

  // inspect the outermost value (should be an Object...)
  std::cout << "Slice: " << s << std::endl;
  std::cout << "Type: " << s.type() << std::endl;
  std::cout << "Bytesize: " << s.byteSize() << std::endl;
  std::cout << "Members: " << s.length() << std::endl;

  if (s.isObject()) {
    Slice ss = s.get("l");  // Now ss points to the subvalue under "l"
    std::cout << "Length of .l: " << ss.length() << std::endl;
    std::cout << "Second entry of .l:" << ss.at(1).getInt() << std::endl;
  }

  Slice sss = s.get("name");
  if (sss.isString()) {
    ValueLength len;
    char const* st = sss.getString(len);
    std::cout << "Name in .name: " << std::string(st, checkOverflow(len))
              << std::endl;
  }

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}